

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::discardSurplusFateCards(Player *this)

{
  Deck *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  ulong uVar4;
  Card *pCVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  _List_node_base local_48;
  ulong local_38;
  
  this_00 = &this->hand;
  iVar8 = 0;
  while( true ) {
    Deck::getDeck_abi_cxx11_((list<Card_*,_std::allocator<Card_*>_> *)&local_48,this_00);
    uVar4 = local_38;
    iVar1 = this->maxHand;
    p_Var3 = local_48._M_next;
    while (p_Var3 != &local_48) {
      p_Var2 = (((_List_base<Card_*,_std::allocator<Card_*>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var2;
    }
    if (uVar4 <= (ulong)(long)iVar1) break;
    Deck::getDeck_abi_cxx11_((list<Card_*,_std::allocator<Card_*>_> *)&local_48,this_00);
    pCVar5 = Deck::popCard(this_00,(Card *)local_48._M_next[1]._M_next);
    p_Var3 = local_48._M_next;
    if (pCVar5 != (Card *)0x0) {
      (*pCVar5->_vptr_Card[3])(pCVar5);
      p_Var3 = local_48._M_next;
    }
    while (p_Var3 != &local_48) {
      p_Var2 = p_Var3->_M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var2;
    }
    iVar8 = iVar8 + 1;
  }
  if (iVar8 == 0) {
    pcVar9 = "Didn\'t discard any cards";
    lVar7 = 0x18;
    poVar6 = (ostream *)&std::cout;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Discarded ",10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
    pcVar9 = " cards";
    lVar7 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void Player::discardSurplusFateCards()                                         //discards cards from player's hand until it is within its limits
{
    int count = 0;

    while (hand.getDeck().size() > maxHand)
    {
        delete hand.popCard(*hand.getDeck().begin());
        count++;
    }

    if (count)
        cout << "Discarded "<<count<<" cards"<<endl;
    else
        cout << "Didn't discard any cards"<<endl;
}